

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O3

void minus_dsp(t_minus *x,t_signal **sp)

{
  code *f;
  
  if (((*sp)->s_n & 7U) == 0) {
    f = minus_perf8;
  }
  else {
    f = minus_perform;
  }
  dsp_add(f,4,(*sp)->s_vec,sp[1]->s_vec,sp[2]->s_vec);
  return;
}

Assistant:

static void minus_dsp(t_minus *x, t_signal **sp)
{
    if (sp[0]->s_n&7)
        dsp_add(minus_perform, 4,
            sp[0]->s_vec, sp[1]->s_vec, sp[2]->s_vec, (t_int)sp[0]->s_n);
    else
        dsp_add(minus_perf8, 4,
            sp[0]->s_vec, sp[1]->s_vec, sp[2]->s_vec, (t_int)sp[0]->s_n);
}